

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

void __thiscall
spvtools::opt::Loop::GetInductionVariables
          (Loop *this,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *induction_variables)

{
  bool bVar1;
  Op OVar2;
  Instruction *local_40;
  Instruction *local_38;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  BasicBlock *__range2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *induction_variables_local;
  Loop *this_local;
  
  BasicBlock::begin((BasicBlock *)&__end2);
  BasicBlock::end((BasicBlock *)&inst);
  while( true ) {
    bVar1 = utils::operator!=(&__end2.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&inst);
    if (!bVar1) break;
    local_38 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    OVar2 = opt::Instruction::opcode(local_38);
    if (OVar2 == OpPhi) {
      local_40 = local_38;
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      push_back(induction_variables,&local_40);
    }
    InstructionList::iterator::operator++(&__end2);
  }
  return;
}

Assistant:

void Loop::GetInductionVariables(
    std::vector<Instruction*>& induction_variables) const {
  for (Instruction& inst : *loop_header_) {
    if (inst.opcode() == spv::Op::OpPhi) {
      induction_variables.push_back(&inst);
    }
  }
}